

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::ConvertDecimal<duckdb::hugeint_t*>
               (hugeint_t *src_ptr,Vector *vector,ArrowArray *array,idx_t size,int64_t nested_offset
               ,uint64_t parent_offset,ArrowScanLocalState *scan_state,ValidityMask *val_mask,
               DecimalBitWidth arrow_bit_width)

{
  PhysicalType type;
  void *pvVar1;
  bool bVar2;
  long lVar3;
  NotImplementedException *this;
  PhysicalType type_00;
  int16_t *result;
  int64_t *piVar4;
  hugeint_t *result_00;
  int32_t *result_01;
  idx_t iVar5;
  int64_t *piVar6;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  allocator local_71;
  string local_70;
  string local_50;
  
  type = (vector->type).physical_type_;
  if (type == INT128) {
    if (arrow_bit_width != DECIMAL_128) {
      result_00 = (hugeint_t *)vector->data;
      piVar4 = &src_ptr->upper;
      for (iVar5 = 0; size != iVar5; iVar5 = iVar5 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar5);
        if (bVar2) {
          input_01.upper = *piVar4;
          input_01.lower = ((hugeint_t *)(piVar4 + -1))->lower;
          TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input_01,result_00,false);
        }
        piVar4 = piVar4 + 2;
        result_00 = result_00 + 1;
      }
      return;
    }
  }
  else if (type == INT32) {
    if (arrow_bit_width != DECIMAL_32) {
      result_01 = (int32_t *)vector->data;
      piVar4 = &src_ptr->upper;
      for (iVar5 = 0; size != iVar5; iVar5 = iVar5 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar5);
        if (bVar2) {
          input_02.upper = *piVar4;
          input_02.lower = ((hugeint_t *)(piVar4 + -1))->lower;
          TryCast::Operation<duckdb::hugeint_t,int>(input_02,result_01,false);
        }
        piVar4 = piVar4 + 2;
        result_01 = result_01 + 1;
      }
      return;
    }
  }
  else {
    if (type != INT64) {
      if (type == INT16) {
        result = (int16_t *)vector->data;
        piVar4 = &src_ptr->upper;
        for (iVar5 = 0; size != iVar5; iVar5 = iVar5 + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar5);
          if (bVar2) {
            input.upper = *piVar4;
            input.lower = ((hugeint_t *)(piVar4 + -1))->lower;
            TryCast::Operation<duckdb::hugeint_t,short>(input,result,false);
          }
          piVar4 = piVar4 + 2;
          result = result + 1;
        }
        return;
      }
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unsupported physical type for Decimal: %s",&local_71);
      TypeIdToString_abi_cxx11_(&local_70,(duckdb *)(ulong)(vector->type).physical_type_,type_00);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this,&local_50,&local_70);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (arrow_bit_width != DECIMAL_64) {
      piVar4 = (int64_t *)vector->data;
      piVar6 = &src_ptr->upper;
      for (iVar5 = 0; size != iVar5; iVar5 = iVar5 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&val_mask->super_TemplatedValidityMask<unsigned_long>,iVar5);
        if (bVar2) {
          input_00.upper = *piVar6;
          input_00.lower = ((hugeint_t *)(piVar6 + -1))->lower;
          TryCast::Operation<duckdb::hugeint_t,long>(input_00,piVar4,false);
        }
        piVar6 = piVar6 + 2;
        piVar4 = piVar4 + 1;
      }
      return;
    }
  }
  pvVar1 = array->buffers[1];
  iVar5 = GetTypeIdSize(type);
  lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  lVar3 = lVar3 + array->offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar3 = array->offset + nested_offset;
  }
  vector->data = (data_ptr_t)(lVar3 * iVar5 + (long)pvVar1);
  return;
}

Assistant:

void ConvertDecimal(SRC src_ptr, Vector &vector, ArrowArray &array, idx_t size, int64_t nested_offset,
                    uint64_t parent_offset, ArrowScanLocalState &scan_state, ValidityMask &val_mask,
                    DecimalBitWidth arrow_bit_width) {

	switch (vector.GetType().InternalType()) {
	case PhysicalType::INT16: {
		auto tgt_ptr = FlatVector::GetData<int16_t>(vector);
		for (idx_t row = 0; row < size; row++) {
			if (val_mask.RowIsValid(row)) {
				auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
				D_ASSERT(result);
				(void)result;
			}
		}
		break;
	}
	case PhysicalType::INT32: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_32) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int32_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT64: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_64) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int64_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT128: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_128) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<hugeint_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}

		break;
	}
	default:
		throw NotImplementedException("Unsupported physical type for Decimal: %s",
		                              TypeIdToString(vector.GetType().InternalType()));
	}
}